

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
assign_iterator<nestl::has_exceptions::exception_ptr_error,int*>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,int *param_3,
          int *param_4)

{
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2aa,
                  "void nestl::impl::vector<int>::assign_iterator(OperationError &, std::input_iterator_tag, InputIterator, InputIterator) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, InputIterator = int *]"
                 );
  }
  if (param_3 != param_4) {
    do {
      insert_value<nestl::has_exceptions::exception_ptr_error,int_const&>
                (this,err,*(const_iterator *)(this + 0x10),param_3);
      if ((err->m_exception)._M_exception_object != (void *)0x0) {
        return;
      }
      param_3 = param_3 + 1;
    } while (param_3 != param_4);
  }
  return;
}

Assistant:

bool vector<T, A>::empty() const NESTL_NOEXCEPT_SPEC
{
    return m_start == m_finish;
}